

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Instance(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  DeadlyImportError *this_00;
  CAMFImporter_NodeElement_Instance *this_01;
  float fVar6;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  byte local_b1;
  undefined4 local_b0;
  undefined2 local_ac;
  bool close_found;
  bool read_flag [6];
  CAMFImporter_NodeElement_Instance *als;
  string local_98;
  undefined4 local_78;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string an;
  uint local_3c;
  int idx_end;
  int idx;
  CAMFImporter_NodeElement *ne;
  string objectid;
  AMFImporter *this_local;
  
  objectid.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&ne);
  _idx_end = (CAMFImporter_NodeElement_Instance *)0x0;
  local_3c = 0;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  for (; (int)local_3c < iVar2; local_3c = local_3c + 1) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)local_3c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,(char *)CONCAT44(extraout_var,iVar3),&local_71);
    std::allocator<char>::~allocator(&local_71);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70,"objectid");
    if (bVar1) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_3c);
      std::__cxx11::string::operator=((string *)&ne,(char *)CONCAT44(extraout_var_00,iVar3));
      local_78 = 4;
    }
    else {
      Throw_IncorrectAttr(this,(string *)local_70);
      local_78 = 0;
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    als._6_1_ = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"\"objectid\" in <instance> must be defined.",
               (allocator<char> *)((long)&als + 7));
    DeadlyImportError::DeadlyImportError(this_00,&local_98);
    als._6_1_ = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this_01 = (CAMFImporter_NodeElement_Instance *)operator_new(0x88);
  CAMFImporter_NodeElement_Instance::CAMFImporter_NodeElement_Instance
            (this_01,this->mNodeElement_Cur);
  _read_flag = this_01;
  _idx_end = this_01;
  std::__cxx11::string::operator=((string *)&this_01->ObjectID,(string *)&ne);
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar4 & 1) == 0) {
    local_ac = 0;
    local_b0 = 0;
    aiVector3t<float>::Set(&_read_flag->Delta,0.0,0.0,0.0);
    aiVector3t<float>::Set(&_read_flag->Rotation,0.0,0.0,0.0);
    ParseHelper_Node_Enter(this,&_idx_end->super_CAMFImporter_NodeElement);
    local_b1 = 0;
    do {
      do {
        while( true ) {
          uVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar4 & 1) == 0) goto LAB_005e11ba;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"deltax",&local_d9)
          ;
          bVar1 = XML_CheckNode_NameEqual(this,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_d9);
          if (bVar1) {
            if ((local_b0 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_100,"deltax",&local_101);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_128,"Only one component can be defined.",&local_129);
              Throw_MoreThanOnceDefined(this,&local_100,&local_128);
              std::__cxx11::string::~string((string *)&local_128);
              std::allocator<char>::~allocator(&local_129);
              std::__cxx11::string::~string((string *)&local_100);
              std::allocator<char>::~allocator(&local_101);
            }
            fVar6 = XML_ReadNode_GetVal_AsFloat(this);
            (_read_flag->Delta).x = fVar6;
            local_b0 = CONCAT31(local_b0._1_3_,1);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_150,"deltay",&local_151);
            bVar1 = XML_CheckNode_NameEqual(this,&local_150);
            std::__cxx11::string::~string((string *)&local_150);
            std::allocator<char>::~allocator(&local_151);
            if (bVar1) {
              if ((local_b0 & 0x100) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_178,"deltay",&local_179);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"Only one component can be defined.",&local_1a1);
                Throw_MoreThanOnceDefined(this,&local_178,&local_1a0);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::allocator<char>::~allocator(&local_1a1);
                std::__cxx11::string::~string((string *)&local_178);
                std::allocator<char>::~allocator(&local_179);
              }
              fVar6 = XML_ReadNode_GetVal_AsFloat(this);
              (_read_flag->Delta).y = fVar6;
              local_b0._0_2_ = CONCAT11(1,(undefined1)local_b0);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c8,"deltaz",&local_1c9);
              bVar1 = XML_CheckNode_NameEqual(this,&local_1c8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::allocator<char>::~allocator(&local_1c9);
              if (bVar1) {
                if ((local_b0 & 0x10000) != 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1f0,"deltaz",&local_1f1);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_218,"Only one component can be defined.",&local_219);
                  Throw_MoreThanOnceDefined(this,&local_1f0,&local_218);
                  std::__cxx11::string::~string((string *)&local_218);
                  std::allocator<char>::~allocator(&local_219);
                  std::__cxx11::string::~string((string *)&local_1f0);
                  std::allocator<char>::~allocator(&local_1f1);
                }
                fVar6 = XML_ReadNode_GetVal_AsFloat(this);
                (_read_flag->Delta).z = fVar6;
                local_b0._0_3_ = CONCAT12(1,(undefined2)local_b0);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_240,"rx",&local_241);
                bVar1 = XML_CheckNode_NameEqual(this,&local_240);
                std::__cxx11::string::~string((string *)&local_240);
                std::allocator<char>::~allocator(&local_241);
                if (bVar1) {
                  if ((local_b0 & 0x1000000) != 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_268,"rx",&local_269);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_290,"Only one component can be defined.",&local_291)
                    ;
                    Throw_MoreThanOnceDefined(this,&local_268,&local_290);
                    std::__cxx11::string::~string((string *)&local_290);
                    std::allocator<char>::~allocator(&local_291);
                    std::__cxx11::string::~string((string *)&local_268);
                    std::allocator<char>::~allocator(&local_269);
                  }
                  fVar6 = XML_ReadNode_GetVal_AsFloat(this);
                  (_read_flag->Rotation).x = fVar6;
                  local_b0 = CONCAT13(1,(undefined3)local_b0);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_2b8,"ry",&local_2b9);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_2b8);
                  std::__cxx11::string::~string((string *)&local_2b8);
                  std::allocator<char>::~allocator(&local_2b9);
                  if (bVar1) {
                    if ((local_ac & 1) != 0) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2e0,"ry",&local_2e1);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_308,"Only one component can be defined.",
                                 &local_309);
                      Throw_MoreThanOnceDefined(this,&local_2e0,&local_308);
                      std::__cxx11::string::~string((string *)&local_308);
                      std::allocator<char>::~allocator(&local_309);
                      std::__cxx11::string::~string((string *)&local_2e0);
                      std::allocator<char>::~allocator(&local_2e1);
                    }
                    fVar6 = XML_ReadNode_GetVal_AsFloat(this);
                    (_read_flag->Rotation).y = fVar6;
                    local_ac = CONCAT11(local_ac._1_1_,1);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_330,"rz",&local_331);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_330);
                    std::__cxx11::string::~string((string *)&local_330);
                    std::allocator<char>::~allocator(&local_331);
                    if (bVar1) {
                      if ((local_ac & 0x100) != 0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_358,"rz",&local_359);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_380,"Only one component can be defined.",
                                   &local_381);
                        Throw_MoreThanOnceDefined(this,&local_358,&local_380);
                        std::__cxx11::string::~string((string *)&local_380);
                        std::allocator<char>::~allocator(&local_381);
                        std::__cxx11::string::~string((string *)&local_358);
                        std::allocator<char>::~allocator(&local_359);
                      }
                      fVar6 = XML_ReadNode_GetVal_AsFloat(this);
                      (_read_flag->Rotation).z = fVar6;
                      local_ac = CONCAT11(1,(undefined1)local_ac);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3a8,"instance",&local_3a9);
                      XML_CheckNode_SkipUnsupported(this,&local_3a8);
                      std::__cxx11::string::~string((string *)&local_3a8);
                      std::allocator<char>::~allocator(&local_3a9);
                    }
                  }
                }
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"instance",&local_3d1)
      ;
      bVar1 = XML_CheckNode_NameEqual(this,&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator(&local_3d1);
    } while (!bVar1);
    local_b1 = 1;
LAB_005e11ba:
    if ((local_b1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"instance",&local_3f9)
      ;
      Throw_CloseNotFound(this,&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator(&local_3f9);
    }
    ParseHelper_Node_Exit(this);
    (_read_flag->Rotation).x = ((_read_flag->Rotation).x * 3.1415927) / 180.0;
    (_read_flag->Rotation).y = ((_read_flag->Rotation).y * 3.1415927) / 180.0;
    (_read_flag->Rotation).z = ((_read_flag->Rotation).z * 3.1415927) / 180.0;
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,(value_type *)&idx_end);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,(value_type *)&idx_end);
  std::__cxx11::string::~string((string *)&ne);
  return;
}

Assistant:

void AMFImporter::ParseNode_Instance()
{
    std::string objectid;
    CAMFImporter_NodeElement* ne( nullptr );

	// Read attributes for node <constellation>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("objectid", objectid, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// used object id must be defined, check that.
	if(objectid.empty()) throw DeadlyImportError("\"objectid\" in <instance> must be defined.");
	// create and define new grouping object.
	ne = new CAMFImporter_NodeElement_Instance(mNodeElement_Cur);

	CAMFImporter_NodeElement_Instance& als = *((CAMFImporter_NodeElement_Instance*)ne);// alias for convenience

	als.ObjectID = objectid;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool read_flag[6] = { false, false, false, false, false, false };

		als.Delta.Set(0, 0, 0);
		als.Rotation.Set(0, 0, 0);
		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("instance");
			MACRO_NODECHECK_READCOMP_F("deltax", read_flag[0], als.Delta.x);
			MACRO_NODECHECK_READCOMP_F("deltay", read_flag[1], als.Delta.y);
			MACRO_NODECHECK_READCOMP_F("deltaz", read_flag[2], als.Delta.z);
			MACRO_NODECHECK_READCOMP_F("rx", read_flag[3], als.Rotation.x);
			MACRO_NODECHECK_READCOMP_F("ry", read_flag[4], als.Rotation.y);
			MACRO_NODECHECK_READCOMP_F("rz", read_flag[5], als.Rotation.z);
		MACRO_NODECHECK_LOOPEND("instance");
		ParseHelper_Node_Exit();
		// also convert degrees to radians.
		als.Rotation.x = AI_MATH_PI_F * als.Rotation.x / 180.0f;
		als.Rotation.y = AI_MATH_PI_F * als.Rotation.y / 180.0f;
		als.Rotation.z = AI_MATH_PI_F * als.Rotation.z / 180.0f;
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}